

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

void p_str(parse *p)

{
  char *pcVar1;
  parse *p_local;
  
  if (p->end <= p->next) {
    seterr(p,0xe);
  }
  while (p->next < p->end) {
    pcVar1 = p->next;
    p->next = pcVar1 + 1;
    ordinary(p,(int)*pcVar1);
  }
  return;
}

Assistant:

static void
p_str(p)
register struct parse *p;
{
	REQUIRE(MORE(), REG_EMPTY);
	while (MORE())
		ordinary(p, GETNEXT());
}